

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

double mpack_node_double_strict(mpack_node_t node)

{
  mpack_tree_t *pmVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar1 = node.tree;
  pmVar2 = node.data;
  if (pmVar1->error == mpack_ok) {
    if (pmVar2->type == mpack_type_double) {
      return (pmVar2->value).d;
    }
    if (pmVar2->type == mpack_type_float) {
      return (double)(pmVar2->value).f;
    }
    pmVar1->error = mpack_error_type;
    if (pmVar1->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar1->error_fn)(pmVar1,mpack_error_type);
      return 0.0;
    }
  }
  return 0.0;
}

Assistant:

MPACK_INLINE double mpack_node_double_strict(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0;

    if (node.data->type == mpack_type_float)
        return (double)node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0;
}